

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O2

void __thiscall polyscope::SlicePlane::buildGUI(SlicePlane *this)

{
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar1;
  pointer pcVar2;
  ulong uVar3;
  vec3 newVal;
  undefined1 auVar4 [16];
  _Alloc_hider label;
  bool bVar5;
  __type selected;
  iterator iVar6;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  undefined1 auVar9 [16];
  allocator local_b9;
  SlicePlane *local_b8;
  string vMeshName;
  string local_70;
  string local_50;
  
  ImGui::PushID((this->name)._M_dataplus._M_p);
  bVar5 = ImGui::Checkbox((this->name)._M_dataplus._M_p,&(this->active).value);
  if (bVar5) {
    setActive(this,(this->active).value);
  }
  ImGui::SameLine(0.0,-1.0);
  pcVar2 = *(pointer *)&(this->color).value;
  aVar1 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)
          (this->color).value.field_2.z;
  vMeshName._M_string_length._4_4_ = (this->transparency).value;
  local_b8 = (SlicePlane *)CONCAT44(local_b8._4_4_,vMeshName._M_string_length._4_4_);
  vMeshName._M_dataplus._M_p = pcVar2;
  vMeshName._M_string_length._0_4_ = aVar1;
  bVar5 = ImGui::ColorEdit4("##color and trans",(float *)&vMeshName,0x20);
  if (!bVar5) goto LAB_001fe16a;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = vMeshName._M_dataplus._M_p;
  newVal.field_2.z = vMeshName._M_string_length._0_4_;
  newVal._0_8_ = vMeshName._M_dataplus._M_p;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = pcVar2;
  uVar3 = vcmpps_avx512vl(auVar9,auVar4,4);
  if (((uVar3 & 1) == 0) && ((uVar3 >> 1 & 1) == 0)) {
    if ((vMeshName._M_string_length._0_4_ != aVar1.z) ||
       (NAN(vMeshName._M_string_length._0_4_) || NAN(aVar1.z))) goto LAB_001fe146;
  }
  else {
LAB_001fe146:
    setColor(this,newVal);
  }
  if ((vMeshName._M_string_length._4_4_ != local_b8._0_4_) ||
     (NAN(vMeshName._M_string_length._4_4_) || NAN(local_b8._0_4_))) {
    setTransparency(this,(double)vMeshName._M_string_length._4_4_);
  }
LAB_001fe16a:
  ImGui::Indent(16.0);
  bVar5 = ImGui::Checkbox("draw plane",&(this->drawPlane).value);
  if (bVar5) {
    setDrawPlane(this,(this->drawPlane).value);
  }
  ImGui::SameLine(0.0,-1.0);
  bVar5 = ImGui::Checkbox("draw widget",&(this->drawWidget).value);
  if (bVar5) {
    setDrawWidget(this,(this->drawWidget).value);
  }
  std::__cxx11::string::string((string *)&vMeshName,"Volume Mesh",&local_b9);
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>_>_>_>_>
                  *)state::structures_abi_cxx11_,&vMeshName);
  std::__cxx11::string::~string((string *)&vMeshName);
  if (iVar6._M_node != (_Base_ptr)(state::structures_abi_cxx11_ + 8)) {
    vMeshName._M_dataplus._M_p = (pointer)0x0;
    bVar5 = ImGui::Button("Inspect",(ImVec2 *)&vMeshName);
    if (bVar5) {
      ImGui::OpenPopup("InspectPopup",0);
    }
    bVar5 = ImGui::BeginPopup("InspectPopup",0);
    if (bVar5) {
      std::__cxx11::string::string((string *)&vMeshName,"Volume Mesh",&local_b9);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<polyscope::Structure,_std::default_delete<polyscope::Structure>_>_>_>_>_>_>_>
                             *)state::structures_abi_cxx11_,&vMeshName);
      std::__cxx11::string::~string((string *)&vMeshName);
      local_b8 = this;
      for (p_Var8 = (pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var8 != &(pmVar7->_M_t)._M_impl.super__Rb_tree_header;
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
        std::__cxx11::string::string((string *)&vMeshName,(string *)(p_Var8 + 1));
        label = vMeshName._M_dataplus;
        selected = std::operator==(&this->inspectedMeshName,&vMeshName);
        bVar5 = ImGui::MenuItem(label._M_p,(char *)0x0,selected,true);
        if (bVar5) {
          std::__cxx11::string::string((string *)&local_50,(string *)&vMeshName);
          setVolumeMeshToInspect(local_b8,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
        }
        std::__cxx11::string::~string((string *)&vMeshName);
      }
      bVar5 = std::operator==(&this->inspectedMeshName,"");
      bVar5 = ImGui::MenuItem("None",(char *)0x0,bVar5,true);
      if (bVar5) {
        std::__cxx11::string::string((string *)&local_70,"",(allocator *)&vMeshName);
        setVolumeMeshToInspect(local_b8,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
      }
      ImGui::EndPopup();
    }
  }
  ImGui::Unindent(16.0);
  ImGui::PopID();
  return;
}

Assistant:

void SlicePlane::buildGUI() {
  ImGui::PushID(name.c_str());

  if (ImGui::Checkbox(name.c_str(), &active.get())) {
    setActive(getActive());
  }

  ImGui::SameLine();

  { // Color transparency box
    // Pack the color & transparency in to a vec4
    glm::vec3 colorBefore = getColor();
    float transparencyBefore = getTransparency();
    std::array<float, 4> color{colorBefore.x, colorBefore.y, colorBefore.z, transparencyBefore};
    if (ImGui::ColorEdit4("##color and trans", &color[0], ImGuiColorEditFlags_NoInputs)) {
      if (color[0] != colorBefore[0] || color[1] != colorBefore[1] || color[2] != colorBefore[2]) {
        setColor(glm::vec3{color[0], color[1], color[2]});
      }
      if (color[3] != transparencyBefore) {
        setTransparency(color[3]);
      }
    }
  }

  ImGui::Indent(16.);
  if (ImGui::Checkbox("draw plane", &drawPlane.get())) {
    setDrawPlane(getDrawPlane());
  }
  ImGui::SameLine();
  if (ImGui::Checkbox("draw widget", &drawWidget.get())) {
    setDrawWidget(getDrawWidget());
  }

  bool haveVolumeMeshes = state::structures.find("Volume Mesh") != state::structures.end();

  if (haveVolumeMeshes) {

    if (ImGui::Button("Inspect")) {
      ImGui::OpenPopup("InspectPopup");
    }
    if (ImGui::BeginPopup("InspectPopup")) {

      //  Loop over volume meshes and offer them to be inspected
      for (std::pair<const std::string, std::unique_ptr<Structure>>& it : state::structures["Volume Mesh"]) {
        std::string vMeshName = it.first;
        if (ImGui::MenuItem(vMeshName.c_str(), NULL, inspectedMeshName == vMeshName)) {
          setVolumeMeshToInspect(vMeshName);
        }
      }

      // "None" option
      if (ImGui::MenuItem("None", NULL, inspectedMeshName == "")) {
        setVolumeMeshToInspect("");
      }

      ImGui::EndPopup();
    }
  }


  ImGui::Unindent(16.);

  ImGui::PopID();
}